

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O0

Try<bool> *
async_simple::coro::syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>
          (Lazy<async_simple::Try<bool>_> *lazy)

{
  Try<bool> *this;
  Try<bool> *in_RDI;
  Try<async_simple::Try<bool>_> value;
  Condition cond;
  Executor *executor;
  Try<bool> *in_stack_ffffffffffffff78;
  Condition *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  type_conflict3 *callback;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 x;
  Try<async_simple::Try<bool>_> *this_00;
  Try<async_simple::Try<bool>_> local_38;
  type_conflict3 local_1c;
  
  x = (undefined1)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  local_1c._4_8_ =
       detail::LazyBase<async_simple::Try<bool>,_false>::getExecutor
                 ((LazyBase<async_simple::Try<bool>,_false> *)0x4902ab);
  if ((Executor *)local_1c._4_8_ != (Executor *)0x0) {
    (*((Executor *)local_1c._4_8_)->_vptr_Executor[3])();
    logicAssert((bool)x,in_stack_ffffffffffffff88);
  }
  callback = &local_1c;
  util::Condition::Condition(in_stack_ffffffffffffff80,(ptrdiff_t)in_stack_ffffffffffffff78);
  this_00 = &local_38;
  Try<async_simple::Try<bool>_>::Try((Try<async_simple::Try<bool>_> *)0x4902f9);
  detail::LazyBase<async_simple::Try<bool>,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<async_simple::Try<bool>,_false> *)this_00,callback);
  std::counting_semaphore<1L>::acquire((counting_semaphore<1L> *)in_stack_ffffffffffffff78);
  this = Try<async_simple::Try<bool>_>::value(this_00);
  Try<bool>::Try(this,in_stack_ffffffffffffff78);
  Try<async_simple::Try<bool>_>::~Try((Try<async_simple::Try<bool>_> *)0x490352);
  return in_RDI;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}